

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

Thread * __thiscall re2::NFA::AllocThread(NFA *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  char **ppcVar3;
  long in_RDI;
  Thread *t;
  Thread *local_8;
  
  local_8 = *(Thread **)(in_RDI + 0x88);
  if (local_8 == (Thread *)0x0) {
    local_8 = (Thread *)operator_new(0x10);
    (local_8->field_0).ref = 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(in_RDI + 0xc);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppcVar3 = (char **)operator_new__(uVar2);
    local_8->capture = ppcVar3;
  }
  else {
    *(anon_union_8_2_62753a03_for_Thread_0 *)(in_RDI + 0x88) = local_8->field_0;
    (local_8->field_0).ref = 1;
  }
  return local_8;
}

Assistant:

NFA::Thread* NFA::AllocThread() {
  Thread* t = free_threads_;
  if (t == NULL) {
    t = new Thread;
    t->ref = 1;
    t->capture = new const char*[ncapture_];
    return t;
  }
  free_threads_ = t->next;
  t->ref = 1;
  return t;
}